

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSObjectFieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  string *psVar1;
  string *extraout_RAX;
  bool in_R8B;
  bool in_R9B;
  ulong uVar2;
  string in_stack_ffffffffffffffc8;
  undefined7 uStack_37;
  
  JSIdent_abi_cxx11_(__return_storage_ptr__,this,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
                     in_R8B,in_R9B,(bool)in_stack_ffffffffffffffc8);
  psVar1 = (string *)std::__cxx11::string::compare((char *)__return_storage_ptr__);
  if ((int)psVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    do {
      if (uVar2 == 0x38) {
        return psVar1;
      }
      psVar1 = (string *)std::__cxx11::string::compare((char *)__return_storage_ptr__);
      uVar2 = uVar2 + 1;
    } while ((int)psVar1 != 0);
    if (0x38 < uVar2) {
      return psVar1;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffc8,"pb_",__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&stack0xffffffffffffffc8);
  psVar1 = (string *)&stack0xffffffffffffffd8;
  if ((string *)CONCAT71(uStack_37,in_stack_ffffffffffffffc8) != psVar1) {
    operator_delete((string *)CONCAT71(uStack_37,in_stack_ffffffffffffffc8));
    psVar1 = extraout_RAX;
  }
  return psVar1;
}

Assistant:

std::string JSObjectFieldName(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ false,
                             /* is_map = */ false,
                             /* drop_list = */ false);
  if (IsReserved(name)) {
    name = "pb_" + name;
  }
  return name;
}